

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

bool __thiscall Reducer::tryToReduceCurrentToUnreachable(Reducer *this)

{
  bool bVar1;
  pointer this_00;
  Expression *expression;
  undefined1 local_30 [8];
  Unreachable un;
  Expression *curr;
  Reducer *this_local;
  
  un.super_SpecificExpression<(wasm::Expression::Id)23>.super_Expression.type.id =
       (uintptr_t)
       wasm::Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::getCurrent
                 (&(this->
                   super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                   ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                   super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>);
  bVar1 = wasm::Expression::is<wasm::Unreachable>
                    ((Expression *)
                     un.super_SpecificExpression<(wasm::Expression::Id)23>.super_Expression.type.id)
  ;
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    wasm::Unreachable::Unreachable((Unreachable *)local_30);
    bVar1 = tryToReplaceCurrent(this,(Expression *)local_30);
    if (bVar1) {
      this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                          (&this->builder);
      expression = (Expression *)wasm::Builder::makeUnreachable(this_00);
      wasm::Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>_>
                  ).super_PostWalker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>.
                  super_Walker<Reducer,_wasm::UnifiedExpressionVisitor<Reducer,_void>_>,expression);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool tryToReduceCurrentToUnreachable() {
    auto* curr = getCurrent();
    if (curr->is<Unreachable>()) {
      return false;
    }
    // try to replace with a trivial value
    Unreachable un;
    if (tryToReplaceCurrent(&un)) {
      replaceCurrent(builder->makeUnreachable());
      return true;
    }
    // maybe a return? TODO
    return false;
  }